

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::QuantileCursor<duckdb::interval_t>::QuantileCursor
          (QuantileCursor<duckdb::interval_t> *this,WindowPartitionInput *partition)

{
  ColumnDataCollection *pCVar1;
  const_reference cVar2;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  this->inputs = *(ColumnDataCollection **)(partition + 8);
  (this->scan).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scan).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan).current_chunk_state.properties = INVALID;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  duckdb::DataChunk::DataChunk(&this->page);
  this->data = (interval_t *)0x0;
  this->validity = (ValidityMask *)0x0;
  pCVar1 = this->inputs;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(partition + 0x18));
  duckdb::ColumnDataCollection::InitializeScan(pCVar1,&this->scan,&local_40,1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  duckdb::ColumnDataCollection::InitializeScanChunk
            ((ColumnDataScanState *)this->inputs,(DataChunk *)&this->scan);
  cVar2 = vector<bool,_true>::get<true>((vector<bool,_true> *)(partition + 0x30),0);
  this->all_valid = cVar2;
  return;
}

Assistant:

explicit QuantileCursor(const WindowPartitionInput &partition) : inputs(*partition.inputs) {
		D_ASSERT(partition.column_ids.size() == 1);
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, page);

		D_ASSERT(partition.all_valid.size() == 1);
		all_valid = partition.all_valid[0];
	}